

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

LY_ERR json_print_metadata(jsonpr_ctx *pctx,lyd_node *node,lys_module *wdmod)

{
  ly_bool lVar1;
  uint uVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  char *pcVar5;
  ulong uVar6;
  lyd_meta *meta;
  
  if (wdmod != (lys_module *)0x0) {
    if ((pctx->options & 2) == 0) {
      uVar2 = (uint)pctx->level * 2;
      pcVar5 = ", ";
    }
    else {
      uVar2 = 0;
      pcVar5 = "\t";
    }
    ly_print_(pctx->out,"%*s\"%s:default\":%strue",(ulong)uVar2,"",wdmod->name,pcVar5 + 1);
    pctx->level_printed = pctx->level;
  }
  meta = node->meta;
  if (meta != (lyd_meta *)0x0) {
    do {
      lVar1 = lyd_metadata_should_print(meta);
      if (lVar1 != '\0') {
        if (pctx->level <= pctx->level_printed) {
          pcVar5 = "";
          if ((pctx->options & 2) == 0) {
            pcVar5 = "\n";
          }
          ly_print_(pctx->out,",%s",pcVar5);
        }
        uVar6 = 0;
        pcVar5 = "\t";
        if ((pctx->options & 2) == 0) {
          uVar6 = (ulong)((uint)pctx->level * 2);
          pcVar5 = ", ";
        }
        ly_print_(pctx->out,"%*s\"%s:%s\":%s",uVar6,"",meta->annotation->module->name,meta->name,
                  pcVar5 + 1);
        plVar4 = (lys_module *)&node[2].schema;
        if (node->schema != (lysc_node *)0x0) {
          plVar4 = node->schema->module;
        }
        LVar3 = json_print_value(pctx,plVar4->ctx,&meta->value,(lys_module *)0x0);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        pctx->level_printed = pctx->level;
      }
      meta = meta->next;
    } while (meta != (lyd_meta *)0x0);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_metadata(struct jsonpr_ctx *pctx, const struct lyd_node *node, const struct lys_module *wdmod)
{
    struct lyd_meta *meta;

    if (wdmod) {
        ly_print_(pctx->out, "%*s\"%s:default\":%strue", INDENT, wdmod->name, DO_FORMAT ? " " : "");
        LEVEL_PRINTED;
    }

    for (meta = node->meta; meta; meta = meta->next) {
        if (!lyd_metadata_should_print(meta)) {
            continue;
        }
        PRINT_COMMA;
        ly_print_(pctx->out, "%*s\"%s:%s\":%s", INDENT, meta->annotation->module->name, meta->name, DO_FORMAT ? " " : "");
        LY_CHECK_RET(json_print_value(pctx, LYD_CTX(node), &meta->value, NULL));
        LEVEL_PRINTED;
    }

    return LY_SUCCESS;
}